

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:485:36)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:485:36)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  Vec3f dy;
  Vec3f dx;
  Vec3f p0;
  undefined1 local_c0 [28];
  undefined1 local_a4 [20];
  pointer local_90;
  pointer local_88;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  _func_int **local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getVec3f((ParseStream *)local_a4);
  ParseStream::getVec3f((ParseStream *)(local_c0 + 0x10));
  ParseStream::getVec3f((ParseStream *)local_c0);
  iVar2 = ParseStream::getInt(this_00);
  iVar3 = ParseStream::getInt(this_00);
  fVar4 = ParseStream::getFloat(this_00);
  local_38 = ZEXT416((uint)local_a4._0_4_);
  local_78 = local_a4._4_8_;
  uStack_70 = 0;
  local_68 = ZEXT416((uint)local_c0._16_4_);
  _local_48 = local_c0._20_8_;
  uStack_40 = 0;
  local_58 = (_func_int **)local_c0._0_8_;
  uStack_50 = 0;
  local_90 = (pointer)0x0;
  local_a4._12_8_ = operator_new(0x48);
  (((pointer)local_a4._12_8_)->first)._M_dataplus._M_p = (pointer)pSVar1;
  *(undefined4 *)&(((pointer)local_a4._12_8_)->first)._M_string_length = local_38._0_4_;
  *(undefined4 *)((long)&(((pointer)local_a4._12_8_)->first)._M_string_length + 4) =
       (undefined4)local_78;
  *(undefined4 *)&(((pointer)local_a4._12_8_)->first).field_2 = local_78._4_4_;
  *(undefined4 *)((long)&(((pointer)local_a4._12_8_)->first).field_2 + 4) = local_68._0_4_;
  *(undefined4 *)((long)&(((pointer)local_a4._12_8_)->first).field_2 + 8) = local_48;
  *(undefined4 *)((long)&(((pointer)local_a4._12_8_)->first).field_2 + 0xc) = uStack_44;
  *(int *)&(((pointer)local_a4._12_8_)->second).fileName.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr = (int)local_58;
  *(int *)((long)&(((pointer)local_a4._12_8_)->second).fileName.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 4) = (int)((ulong)local_58 >> 0x20);
  *(undefined4 *)
   &(((pointer)local_a4._12_8_)->second).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = local_c0._8_4_;
  (((pointer)local_a4._12_8_)->second).lineNumber = (long)iVar2;
  (((pointer)local_a4._12_8_)->second).colNumber = (long)iVar3;
  *(float *)&(((pointer)(local_a4._12_8_ + 0x40))->first)._M_dataplus._M_p = fVar4;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:492:27)>
             ::_M_invoke;
  local_88 = (pointer)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:492:27)>
                      ::_M_manager;
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&pSVar1->futures
             ,(function<void_()> *)(local_a4 + 0xc));
  if (local_88 != (pointer)0x0) {
    (*(code *)local_88)(local_a4 + 0xc,local_a4 + 0xc,3);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }